

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O3

bool vkt::pipeline::anon_unknown_0::validateResultImage
               (TestTexture *texture,VkImageViewType imageViewType,
               VkImageSubresourceRange *subresource,Sampler *sampler,
               VkComponentMapping *componentMapping,ConstPixelBufferAccess *coordAccess,
               Vec2 *lodBounds,LookupPrecision *lookupPrecision,Vec4 *lookupScale,Vec4 *lookupBias,
               ConstPixelBufferAccess *resultAccess,PixelBufferAccess *errorAccess)

{
  float *pfVar1;
  pointer pCVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  Vec4 VVar24;
  bool bVar25;
  bool bVar26;
  TextureChannelClass TVar27;
  Texture1DView *texture_00;
  Texture1DArrayView *this;
  Texture3DView *this_00;
  long lVar28;
  TextureCubeView *this_01;
  Texture2DView *texture_01;
  long *plVar29;
  Texture2DArrayView *this_02;
  long *plVar30;
  long lVar31;
  TextureCubeArrayView *this_03;
  Texture3D *this_04;
  Texture1D *this_05;
  Texture2D *this_06;
  Texture1DArray *this_07;
  Texture2DArray *this_08;
  TextureCubeArray *this_09;
  TextureCube *this_10;
  int iVar32;
  int x;
  ConstPixelBufferAccess *pCVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  Texture3D *pTVar37;
  Texture1D *pTVar38;
  Texture2D *pTVar39;
  Texture1DArray *pTVar40;
  Texture2DArray *pTVar41;
  TextureCubeArray *pTVar42;
  long lVar43;
  int iVar44;
  uint uVar59;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  Vec4 texCoord_7;
  Vec4 resultPixel;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  ConstPixelBufferAccess *local_128;
  undefined4 local_f8;
  undefined4 uStack_f4;
  Vec4 texCoord;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> levels;
  UniquePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> swizzledTex;
  Vec4 resultColor;
  undefined1 local_88 [16];
  void *local_78;
  UniquePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> swizzledTex_6;
  int x_00;
  
  levels.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  levels.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  levels.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x = (int)resultAccess;
  x_00 = (int)coordAccess;
  switch(imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar32 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar32) {
      lVar36 = 0;
      lVar43 = 0;
      do {
        (*texture->_vptr_TestTexture[8])
                  ((ConstPixelBufferAccess *)&resultPixel,texture,
                   (ulong)(subresource->baseMipLevel + (int)lVar43));
        tcu::getSubregion((ConstPixelBufferAccess *)&resultColor,
                          (ConstPixelBufferAccess *)&resultPixel,0,0,0,(int)resultPixel.m_data[2],1,
                          1);
        *(void **)((long)(&(levels.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar36) =
             local_78;
        *(undefined1 (*) [16])
         ((long)((levels.
                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar36 + 8) =
             local_88;
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar36 + -8);
        *(undefined8 *)pfVar1 = resultColor.m_data._0_8_;
        *(undefined8 *)(pfVar1 + 2) = resultColor.m_data._8_8_;
        lVar43 = lVar43 + 1;
        iVar32 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar36 = lVar36 + 0x28;
      } while (lVar43 < iVar32);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    texture_00 = (Texture1DView *)operator_new(0x10);
    texture_00->m_numLevels = iVar32;
    texture_00->m_levels = pCVar2;
    bVar25 = isIdentitySwizzle(componentMapping);
    local_f8 = SUB84(texture_00,0);
    uStack_f4 = (undefined4)((ulong)texture_00 >> 0x20);
    if (bVar25) {
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
        bVar25 = true;
      }
      else {
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
              auVar45._0_4_ = resultPixel.m_data[0] - lookupBias->m_data[0];
              auVar45._4_4_ = resultPixel.m_data[1] - lookupBias->m_data[1];
              auVar45._8_4_ = resultPixel.m_data[2] - lookupBias->m_data[2];
              auVar45._12_4_ = resultPixel.m_data[3] - lookupBias->m_data[3];
              resultColor.m_data =
                   (float  [4])divps(auVar45,*(undefined1 (*) [16])lookupScale->m_data);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
              bVar26 = tcu::isLookupResultValid
                                 (texture_00,sampler,lookupPrecision,texCoord.m_data[0],lodBounds,
                                  &resultColor);
              uVar59 = (int)((uint)bVar26 << 0x1f) >> 0x1f;
              texCoord_7.m_data._0_8_ =
                   ~CONCAT44(uVar59,(int)((uint)bVar26 << 0x1f) >> 0x1f) &
                   SUB168(ZEXT416(0x3f800000),0) | ((ulong)uVar59 & 0x3f800000) << 0x20;
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
    }
    else {
      TVar27 = tcu::getTextureChannelClass((pCVar2->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar27 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar27 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      iVar32 = (texture_00->m_levels->m_size).m_data[0];
      this_05 = (Texture1D *)operator_new(0x50);
      tcu::Texture1D::Texture1D(this_05,(TextureFormat *)&resultPixel,iVar32);
      pTVar38 = this_05;
      if (0 < texture_00->m_numLevels) {
        lVar43 = 0;
        lVar36 = 0;
        resultPixel.m_data._0_8_ = this_05;
        do {
          tcu::Texture1D::allocLevel(this_05,(int)lVar36);
          swizzle((ConstPixelBufferAccess *)
                  ((long)(texture_00->m_levels->m_size).m_data + lVar43 + -8),
                  (PixelBufferAccess *)
                  ((long)(((this_05->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess)
                         .m_size.m_data + lVar43 + -8),componentMapping);
          lVar36 = lVar36 + 1;
          lVar43 = lVar43 + 0x28;
          pTVar38 = (Texture1D *)resultPixel.m_data._0_8_;
        } while (lVar36 < texture_00->m_numLevels);
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           pTVar38;
      de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::reset
                ((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)&resultPixel);
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupScale->m_data;
      fVar4 = resultPixel.m_data[componentMapping->a];
      fVar5 = resultPixel.m_data[componentMapping->b];
      fVar6 = resultPixel.m_data[componentMapping->g];
      fVar7 = resultPixel.m_data[componentMapping->r];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupBias->m_data;
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
        bVar25 = true;
      }
      else {
        fVar8 = resultPixel.m_data[componentMapping->a];
        fVar9 = resultPixel.m_data[componentMapping->b];
        fVar10 = resultPixel.m_data[componentMapping->g];
        fVar11 = resultPixel.m_data[componentMapping->r];
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
              auVar53._0_4_ = resultPixel.m_data[0] - fVar11;
              auVar53._4_4_ = resultPixel.m_data[1] - fVar10;
              auVar53._8_4_ = resultPixel.m_data[2] - fVar9;
              auVar53._12_4_ = resultPixel.m_data[3] - fVar8;
              auVar17._4_4_ = fVar6;
              auVar17._0_4_ = fVar7;
              auVar17._8_4_ = fVar5;
              auVar17._12_4_ = fVar4;
              resultColor.m_data = (float  [4])divps(auVar53,auVar17);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
              texCoord_7.m_data._8_8_ = (pTVar38->m_view).m_levels;
              texCoord_7.m_data[0] = (float)(pTVar38->m_view).m_numLevels;
              bVar26 = tcu::isLookupResultValid
                                 ((Texture1DView *)&texCoord_7,sampler,lookupPrecision,
                                  texCoord.m_data[0],lodBounds,&resultColor);
              uVar59 = (int)((uint)bVar26 << 0x1f) >> 0x1f;
              texCoord_7.m_data._0_8_ =
                   ~CONCAT44(uVar59,(int)((uint)bVar26 << 0x1f) >> 0x1f) &
                   SUB168(ZEXT416(0x3f800000),0) | ((ulong)uVar59 & 0x3f800000) << 0x20;
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
      de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::reset
                (&swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>)
      ;
    }
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
    plVar30 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2D::typeinfo,0);
    plVar29 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2DArray::typeinfo,0)
    ;
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar32 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar32) {
      lVar43 = 0;
      lVar36 = 0;
      do {
        if (plVar30 == (long *)0x0) {
          lVar31 = (**(code **)(*plVar29 + 0x80))();
        }
        else {
          lVar31 = (**(code **)(*plVar30 + 0x80))(plVar30);
        }
        pCVar33 = (ConstPixelBufferAccess *)
                  (*(long *)(lVar31 + 0x20) +
                  (long)(int)(subresource->baseMipLevel + (int)lVar36) * 0x28);
        tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar33,0,0,
                          subresource->baseArrayLayer,(pCVar33->m_size).m_data[0],
                          (pCVar33->m_size).m_data[1],1);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar43) = local_128;
        puVar3 = (undefined8 *)
                 ((long)((levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar43 + 8);
        *puVar3 = CONCAT44(iStack_134,local_138);
        puVar3[1] = CONCAT44(iStack_12c,iStack_130);
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar43 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(ulong *)(pfVar1 + 2) = CONCAT44(resultPixel.m_data[3],resultPixel.m_data[2]);
        lVar36 = lVar36 + 1;
        iVar32 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar43 = lVar43 + 0x28;
      } while (lVar36 < iVar32);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    texture_01 = (Texture2DView *)operator_new(0x10);
    texture_01->m_numLevels = iVar32;
    texture_01->m_levels = pCVar2;
    bVar25 = isIdentitySwizzle(componentMapping);
    local_f8 = SUB84(texture_01,0);
    uStack_f4 = (undefined4)((ulong)texture_01 >> 0x20);
    if (bVar25) {
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
LAB_004e510a:
        bVar25 = true;
      }
      else {
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
              auVar49._0_4_ = resultPixel.m_data[0] - lookupBias->m_data[0];
              auVar49._4_4_ = resultPixel.m_data[1] - lookupBias->m_data[1];
              auVar49._8_4_ = resultPixel.m_data[2] - lookupBias->m_data[2];
              auVar49._12_4_ = resultPixel.m_data[3] - lookupBias->m_data[3];
              resultColor.m_data =
                   (float  [4])divps(auVar49,*(undefined1 (*) [16])lookupScale->m_data);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
              VVar24 = texCoord;
              texCoord_7.m_data[0] = texCoord.m_data[0];
              texCoord_7.m_data[1] = texCoord.m_data[1];
              texCoord = VVar24;
              bVar26 = tcu::isLookupResultValid
                                 (texture_01,sampler,lookupPrecision,(Vec2 *)&texCoord_7,lodBounds,
                                  &resultColor);
              uVar59 = (int)((uint)bVar26 << 0x1f) >> 0x1f;
              texCoord_7.m_data._0_8_ =
                   ~CONCAT44(uVar59,(int)((uint)bVar26 << 0x1f) >> 0x1f) &
                   SUB168(ZEXT416(0x3f800000),0) | ((ulong)uVar59 & 0x3f800000) << 0x20;
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
    }
    else {
      TVar27 = tcu::getTextureChannelClass((pCVar2->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar27 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar27 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      iVar32 = (texture_01->m_levels->m_size).m_data[0];
      iVar12 = (texture_01->m_levels->m_size).m_data[1];
      this_06 = (Texture2D *)operator_new(0x50);
      tcu::Texture2D::Texture2D(this_06,(TextureFormat *)&resultPixel,iVar32,iVar12);
      pTVar39 = this_06;
      if (0 < texture_01->m_numLevels) {
        lVar43 = 0;
        lVar36 = 0;
        resultPixel.m_data._0_8_ = this_06;
        do {
          tcu::Texture2D::allocLevel(this_06,(int)lVar36);
          swizzle((ConstPixelBufferAccess *)
                  ((long)(texture_01->m_levels->m_size).m_data + lVar43 + -8),
                  (PixelBufferAccess *)
                  ((long)(((this_06->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess)
                         .m_size.m_data + lVar43 + -8),componentMapping);
          lVar36 = lVar36 + 1;
          lVar43 = lVar43 + 0x28;
          pTVar39 = (Texture2D *)resultPixel.m_data._0_8_;
        } while (lVar36 < texture_01->m_numLevels);
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)pTVar39;
      de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
                ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&resultPixel);
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupScale->m_data;
      fVar4 = resultPixel.m_data[componentMapping->a];
      fVar5 = resultPixel.m_data[componentMapping->b];
      fVar6 = resultPixel.m_data[componentMapping->g];
      fVar7 = resultPixel.m_data[componentMapping->r];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupBias->m_data;
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
        bVar25 = true;
      }
      else {
        fVar8 = resultPixel.m_data[componentMapping->a];
        fVar9 = resultPixel.m_data[componentMapping->b];
        fVar10 = resultPixel.m_data[componentMapping->g];
        fVar11 = resultPixel.m_data[componentMapping->r];
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
              auVar54._0_4_ = resultPixel.m_data[0] - fVar11;
              auVar54._4_4_ = resultPixel.m_data[1] - fVar10;
              auVar54._8_4_ = resultPixel.m_data[2] - fVar9;
              auVar54._12_4_ = resultPixel.m_data[3] - fVar8;
              auVar18._4_4_ = fVar6;
              auVar18._0_4_ = fVar7;
              auVar18._8_4_ = fVar5;
              auVar18._12_4_ = fVar4;
              resultColor.m_data = (float  [4])divps(auVar54,auVar18);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
              texCoord_7.m_data._8_8_ = (pTVar39->m_view).m_levels;
              texCoord_7.m_data[0] = (float)(pTVar39->m_view).m_numLevels;
              swizzledTex_6.
              super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
              m_data.ptr = (TextureCubeArray *)texCoord.m_data._0_8_;
              bVar26 = tcu::isLookupResultValid
                                 ((Texture2DView *)&texCoord_7,sampler,lookupPrecision,
                                  (Vec2 *)&swizzledTex_6,lodBounds,&resultColor);
              uVar59 = (int)((uint)bVar26 << 0x1f) >> 0x1f;
              texCoord_7.m_data._0_8_ =
                   ~CONCAT44(uVar59,(int)((uint)bVar26 << 0x1f) >> 0x1f) &
                   SUB168(ZEXT416(0x3f800000),0) | ((ulong)uVar59 & 0x3f800000) << 0x20;
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
      de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
                ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&swizzledTex);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar32 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar32) {
      lVar36 = 0;
      lVar43 = 0;
      do {
        (*texture->_vptr_TestTexture[8])
                  (&resultPixel,texture,(ulong)(subresource->baseMipLevel + (int)lVar43),
                   (ulong)subresource->baseArrayLayer);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar36) = local_128;
        auVar13._4_4_ = iStack_134;
        auVar13._0_4_ = local_138;
        auVar13._8_4_ = iStack_130;
        auVar13._12_4_ = iStack_12c;
        *(undefined1 (*) [16])
         ((long)((levels.
                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar36 + 8) = auVar13
        ;
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar36 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(ulong *)(pfVar1 + 2) = CONCAT44(resultPixel.m_data[3],resultPixel.m_data[2]);
        lVar43 = lVar43 + 1;
        iVar32 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar36 = lVar36 + 0x28;
      } while (lVar43 < iVar32);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (Texture3DView *)operator_new(0x10);
    tcu::Texture3DView::Texture3DView(this_00,iVar32,pCVar2);
    bVar25 = isIdentitySwizzle(componentMapping);
    local_f8 = SUB84(this_00,0);
    uStack_f4 = (undefined4)((ulong)this_00 >> 0x20);
    if (bVar25) {
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) goto LAB_004e510a;
      iVar12 = (resultAccess->m_size).m_data[0];
      iVar35 = 0;
      bVar25 = true;
      do {
        if (0 < iVar12) {
          iVar44 = 0;
          do {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
            auVar47._0_4_ = resultPixel.m_data[0] - lookupBias->m_data[0];
            auVar47._4_4_ = resultPixel.m_data[1] - lookupBias->m_data[1];
            auVar47._8_4_ = resultPixel.m_data[2] - lookupBias->m_data[2];
            auVar47._12_4_ = resultPixel.m_data[3] - lookupBias->m_data[3];
            resultColor.m_data =
                 (float  [4])divps(auVar47,*(undefined1 (*) [16])lookupScale->m_data);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
            VVar24 = texCoord;
            texCoord_7.m_data[0] = texCoord.m_data[0];
            texCoord_7.m_data[1] = texCoord.m_data[1];
            texCoord_7.m_data[2] = texCoord.m_data[2];
            texCoord = VVar24;
            bVar26 = tcu::isLookupResultValid
                               (this_00,sampler,lookupPrecision,(Vec3 *)&texCoord_7,lodBounds,
                                &resultColor);
            texCoord_7.m_data[1] = 0.0;
            if (bVar26) {
              texCoord_7.m_data[0] = 0.0;
              texCoord_7.m_data[1] = 1.0;
            }
            else {
              texCoord_7.m_data[0] = 1.0;
            }
            texCoord_7.m_data[2] = 0.0;
            texCoord_7.m_data[3] = 1.0;
            tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
            bVar25 = (bool)(bVar25 & bVar26);
            iVar44 = iVar44 + 1;
          } while (iVar12 != iVar44);
        }
        iVar35 = iVar35 + 1;
      } while (iVar35 != iVar32);
    }
    else {
      TVar27 = tcu::getTextureChannelClass((this_00->m_levels->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar27 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar27 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      pCVar33 = this_00->m_levels;
      this_04 = (Texture3D *)operator_new(0x58);
      tcu::Texture3D::Texture3D
                (this_04,(TextureFormat *)&resultPixel,(pCVar33->m_size).m_data[0],
                 (pCVar33->m_size).m_data[1],(pCVar33->m_size).m_data[2]);
      pTVar37 = this_04;
      if (0 < this_00->m_numLevels) {
        lVar43 = 0;
        lVar36 = 0;
        resultPixel.m_data._0_8_ = this_04;
        do {
          tcu::Texture3D::allocLevel(this_04,(int)lVar36);
          swizzle((ConstPixelBufferAccess *)((long)(this_00->m_levels->m_size).m_data + lVar43 + -8)
                  ,(PixelBufferAccess *)
                   ((long)(((this_04->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar43 + -8),componentMapping);
          lVar36 = lVar36 + 1;
          lVar43 = lVar43 + 0x28;
          pTVar37 = (Texture3D *)resultPixel.m_data._0_8_;
        } while (lVar36 < this_00->m_numLevels);
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)pTVar37;
      de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::reset
                ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&resultPixel);
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupScale->m_data;
      fVar4 = resultPixel.m_data[componentMapping->a];
      fVar5 = resultPixel.m_data[componentMapping->b];
      fVar6 = resultPixel.m_data[componentMapping->g];
      fVar7 = resultPixel.m_data[componentMapping->r];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupBias->m_data;
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
        bVar25 = true;
      }
      else {
        fVar8 = resultPixel.m_data[componentMapping->a];
        fVar9 = resultPixel.m_data[componentMapping->b];
        fVar10 = resultPixel.m_data[componentMapping->g];
        fVar11 = resultPixel.m_data[componentMapping->r];
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
              auVar52._0_4_ = resultPixel.m_data[0] - fVar11;
              auVar52._4_4_ = resultPixel.m_data[1] - fVar10;
              auVar52._8_4_ = resultPixel.m_data[2] - fVar9;
              auVar52._12_4_ = resultPixel.m_data[3] - fVar8;
              auVar16._4_4_ = fVar6;
              auVar16._0_4_ = fVar7;
              auVar16._8_4_ = fVar5;
              auVar16._12_4_ = fVar4;
              resultColor.m_data = (float  [4])divps(auVar52,auVar16);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
              texCoord_7.m_data._8_8_ = (pTVar37->m_view).m_levels;
              texCoord_7.m_data[0] = (float)(pTVar37->m_view).m_numLevels;
              swizzledTex_6.
              super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
              m_data.ptr = (TextureCubeArray *)texCoord.m_data._0_8_;
              swizzledTex_6.
              super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
              m_data._8_4_ = texCoord.m_data[2];
              bVar26 = tcu::isLookupResultValid
                                 ((Texture3DView *)&texCoord_7,sampler,lookupPrecision,
                                  (Vec3 *)&swizzledTex_6,lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar26) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
      de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::reset
                ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&swizzledTex);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
    plVar30 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTextureCube::typeinfo,0);
    plVar29 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTextureCubeArray::typeinfo,
                                     0);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)(subresource->levelCount * 6));
    uVar34 = (ulong)subresource->levelCount;
    lVar36 = 0;
    do {
      if (0 < (int)uVar34) {
        lVar31 = 0;
        lVar43 = 0;
        do {
          if (plVar29 == (long *)0x0) {
            lVar28 = (**(code **)(*plVar30 + 0x80))();
            pCVar33 = (ConstPixelBufferAccess *)
                      (*(long *)(lVar28 + 0xa0 +
                                (ulong)(uint)(&pipeline::(anonymous_namespace)::
                                               getTextureCubeView(vkt::pipeline::TestTexture_const&,vk::VkImageSubresourceRange_const&,std::vector<tcu::ConstPixelBufferAccess,std::allocator<tcu::ConstPixelBufferAccess>>&)
                                               ::s_faceMap)[lVar36] * 0x18) + lVar31);
            iVar32 = 0;
          }
          else {
            lVar28 = (**(code **)(*plVar29 + 0x80))(plVar29);
            pCVar33 = (ConstPixelBufferAccess *)
                      ((long)(int)(subresource->baseMipLevel + (int)lVar43) * 0x28 +
                      *(long *)(lVar28 + 0x20));
            iVar32 = (int)lVar36;
          }
          tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar33,0,0,
                            iVar32 + subresource->baseArrayLayer,(pCVar33->m_size).m_data[0],
                            (pCVar33->m_size).m_data[1],1);
          uVar59 = subresource->levelCount * (int)lVar36 + (int)lVar43;
          levels.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar59].m_data = local_128;
          auVar14._4_4_ = iStack_134;
          auVar14._0_4_ = local_138;
          auVar14._8_4_ = iStack_130;
          auVar14._12_4_ = iStack_12c;
          *(undefined1 (*) [16])
           (levels.
            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar59].m_size.m_data + 2) = auVar14;
          pCVar2 = levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar59;
          (pCVar2->m_format).order = (ChannelOrder)resultPixel.m_data[0];
          (pCVar2->m_format).type = (ChannelType)resultPixel.m_data[1];
          *(ulong *)(pCVar2->m_size).m_data = CONCAT44(resultPixel.m_data[3],resultPixel.m_data[2]);
          lVar43 = lVar43 + 1;
          uVar34 = (ulong)(int)subresource->levelCount;
          lVar31 = lVar31 + 0x28;
        } while (lVar43 < (long)uVar34);
      }
      pCVar2 = levels.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar36 = lVar36 + 1;
    } while (lVar36 != 6);
    uVar59 = 0;
    lVar36 = 0;
    do {
      *(pointer *)
       (resultPixel.m_data +
       (ulong)*(uint *)((long)&pipeline::(anonymous_namespace)::
                               getTextureCubeView(vkt::pipeline::TestTexture_const&,vk::VkImageSubresourceRange_const&,std::vector<tcu::ConstPixelBufferAccess,std::allocator<tcu::ConstPixelBufferAccess>>&)
                               ::s_faceMap + lVar36) * 2) = pCVar2 + uVar59;
      lVar36 = lVar36 + 4;
      uVar59 = uVar59 + (int)uVar34;
    } while (lVar36 != 0x18);
    this_01 = (TextureCubeView *)operator_new(0x38);
    tcu::TextureCubeView::TextureCubeView
              (this_01,(int)uVar34,(ConstPixelBufferAccess *(*) [6])&resultPixel);
    bVar25 = isIdentitySwizzle(componentMapping);
    if (bVar25) {
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
        bVar25 = true;
      }
      else {
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
              auVar48._0_4_ = resultPixel.m_data[0] - lookupBias->m_data[0];
              auVar48._4_4_ = resultPixel.m_data[1] - lookupBias->m_data[1];
              auVar48._8_4_ = resultPixel.m_data[2] - lookupBias->m_data[2];
              auVar48._12_4_ = resultPixel.m_data[3] - lookupBias->m_data[3];
              resultColor.m_data =
                   (float  [4])divps(auVar48,*(undefined1 (*) [16])lookupScale->m_data);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
              VVar24 = texCoord;
              texCoord_7.m_data[0] = texCoord.m_data[0];
              texCoord_7.m_data[1] = texCoord.m_data[1];
              texCoord_7.m_data[2] = texCoord.m_data[2];
              texCoord = VVar24;
              bVar26 = tcu::isLookupResultValid
                                 (this_01,sampler,lookupPrecision,(Vec3 *)&texCoord_7,lodBounds,
                                  &resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar26) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
    }
    else {
      this_10 = (TextureCube *)operator_new(0x168);
      TVar27 = tcu::getTextureChannelClass((this_01->m_levels[0]->m_format).type);
      uVar34 = 0x1d00000008;
      if (TVar27 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        uVar34 = (ulong)(TVar27 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      resultColor.m_data[0] = (float)(int)uVar34;
      resultColor.m_data[1] = (float)(int)(uVar34 >> 0x20);
      if (this_01->m_numLevels < 1) {
        iVar32 = 0;
      }
      else {
        iVar32 = (this_01->m_levels[0]->m_size).m_data[0];
      }
      tcu::TextureCube::TextureCube(this_10,(TextureFormat *)&resultColor,iVar32);
      uVar34 = (ulong)(uint)this_01->m_numLevels;
      lVar36 = 0;
      resultPixel.m_data._0_8_ = this_10;
      do {
        if (0 < (int)uVar34) {
          lVar43 = 0;
          lVar31 = 0;
          do {
            tcu::TextureCube::allocLevel(this_10,(CubeFace)lVar36,(int)lVar31);
            swizzle((ConstPixelBufferAccess *)
                    ((long)(this_01->m_levels[lVar36]->m_size).m_data + lVar43 + -8),
                    (PixelBufferAccess *)
                    ((long)((this_10->m_access[lVar36].
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_ConstPixelBufferAccess).m_size.m_data + lVar43 + -8),
                    componentMapping);
            lVar31 = lVar31 + 1;
            uVar34 = (ulong)this_01->m_numLevels;
            lVar43 = lVar43 + 0x28;
          } while (lVar31 < (long)uVar34);
        }
        uVar23 = resultPixel.m_data._0_8_;
        lVar36 = lVar36 + 1;
      } while (lVar36 != 6);
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)uVar23;
      de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::reset
                ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&resultPixel
                );
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupScale->m_data;
      fVar4 = resultPixel.m_data[componentMapping->a];
      fVar5 = resultPixel.m_data[componentMapping->b];
      fVar6 = resultPixel.m_data[componentMapping->g];
      fVar7 = resultPixel.m_data[componentMapping->r];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupBias->m_data;
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
        bVar25 = true;
      }
      else {
        fVar8 = resultPixel.m_data[componentMapping->a];
        fVar9 = resultPixel.m_data[componentMapping->b];
        fVar10 = resultPixel.m_data[componentMapping->g];
        fVar11 = resultPixel.m_data[componentMapping->r];
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultColor,x,iVar44,iVar35);
              auVar58._0_4_ = resultColor.m_data[0] - fVar11;
              auVar58._4_4_ = resultColor.m_data[1] - fVar10;
              auVar58._8_4_ = resultColor.m_data[2] - fVar9;
              auVar58._12_4_ = resultColor.m_data[3] - fVar8;
              auVar21._4_4_ = fVar6;
              auVar21._0_4_ = fVar7;
              auVar21._8_4_ = fVar5;
              auVar21._12_4_ = fVar4;
              texCoord.m_data = (float  [4])divps(auVar58,auVar21);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord_7,x_00,iVar44,iVar35);
              resultPixel.m_data._0_8_ = *(undefined8 *)(uVar23 + 0x130);
              resultPixel.m_data[2] = (float)*(undefined8 *)(uVar23 + 0x138);
              resultPixel.m_data[3] = (float)((ulong)*(undefined8 *)(uVar23 + 0x138) >> 0x20);
              swizzledTex_6.
              super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
              m_data.ptr = (TextureCubeArray *)texCoord_7.m_data._0_8_;
              swizzledTex_6.
              super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
              m_data._8_4_ = texCoord_7.m_data[2];
              bVar26 = tcu::isLookupResultValid
                                 ((TextureCubeView *)&resultPixel,sampler,lookupPrecision,
                                  (Vec3 *)&swizzledTex_6,lodBounds,&texCoord);
              resultPixel.m_data[1] = 0.0;
              if (bVar26) {
                resultPixel.m_data[0] = 0.0;
                resultPixel.m_data[1] = 1.0;
              }
              else {
                resultPixel.m_data[0] = 1.0;
              }
              resultPixel.m_data[2] = 0.0;
              resultPixel.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&resultPixel,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
      de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::reset
                ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&swizzledTex
                );
    }
    uVar34 = 0x38;
    goto LAB_004e6222;
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    plVar29 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture1D::typeinfo,0);
    plVar30 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture1DArray::typeinfo,0)
    ;
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar32 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar32) {
      if (plVar29 != (long *)0x0) {
        plVar30 = plVar29;
      }
      lVar36 = 0;
      lVar43 = 0;
      do {
        lVar31 = (**(code **)(*plVar30 + 0x80))(plVar30);
        pCVar33 = (ConstPixelBufferAccess *)
                  (*(long *)(lVar31 + 0x20) +
                  (long)(int)(subresource->baseMipLevel + (int)lVar43) * 0x28);
        tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar33,0,
                          subresource->baseArrayLayer,0,(pCVar33->m_size).m_data[0],
                          subresource->layerCount,1);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar36) = local_128;
        puVar3 = (undefined8 *)
                 ((long)((levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar36 + 8);
        *puVar3 = CONCAT44(iStack_134,local_138);
        puVar3[1] = CONCAT44(iStack_12c,iStack_130);
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar36 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(ulong *)(pfVar1 + 2) = CONCAT44(resultPixel.m_data[3],resultPixel.m_data[2]);
        lVar43 = lVar43 + 1;
        iVar32 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar36 = lVar36 + 0x28;
      } while (lVar43 < iVar32);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this = (Texture1DArrayView *)operator_new(0x10);
    tcu::Texture1DArrayView::Texture1DArrayView(this,iVar32,pCVar2);
    bVar25 = isIdentitySwizzle(componentMapping);
    local_f8 = SUB84(this,0);
    uStack_f4 = (undefined4)((ulong)this >> 0x20);
    if (bVar25) {
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) goto LAB_004e510a;
      iVar12 = (resultAccess->m_size).m_data[0];
      iVar35 = 0;
      bVar25 = true;
      do {
        if (0 < iVar12) {
          iVar44 = 0;
          do {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
            auVar46._0_4_ = resultPixel.m_data[0] - lookupBias->m_data[0];
            auVar46._4_4_ = resultPixel.m_data[1] - lookupBias->m_data[1];
            auVar46._8_4_ = resultPixel.m_data[2] - lookupBias->m_data[2];
            auVar46._12_4_ = resultPixel.m_data[3] - lookupBias->m_data[3];
            resultColor.m_data =
                 (float  [4])divps(auVar46,*(undefined1 (*) [16])lookupScale->m_data);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
            VVar24 = texCoord;
            texCoord_7.m_data[0] = texCoord.m_data[0];
            texCoord_7.m_data[1] = texCoord.m_data[1];
            texCoord = VVar24;
            bVar26 = tcu::isLookupResultValid
                               (this,sampler,lookupPrecision,(Vec2 *)&texCoord_7,lodBounds,
                                &resultColor);
            uVar59 = (int)((uint)bVar26 << 0x1f) >> 0x1f;
            texCoord_7.m_data._0_8_ =
                 ~CONCAT44(uVar59,(int)((uint)bVar26 << 0x1f) >> 0x1f) &
                 SUB168(ZEXT416(0x3f800000),0) | ((ulong)uVar59 & 0x3f800000) << 0x20;
            texCoord_7.m_data[2] = 0.0;
            texCoord_7.m_data[3] = 1.0;
            tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
            bVar25 = (bool)(bVar25 & bVar26);
            iVar44 = iVar44 + 1;
          } while (iVar12 != iVar44);
        }
        iVar35 = iVar35 + 1;
      } while (iVar35 != iVar32);
    }
    else {
      TVar27 = tcu::getTextureChannelClass((this->m_levels->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar27 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar27 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      iVar32 = (this->m_levels->m_size).m_data[0];
      iVar12 = (this->m_levels->m_size).m_data[1];
      this_07 = (Texture1DArray *)operator_new(0x50);
      tcu::Texture1DArray::Texture1DArray(this_07,(TextureFormat *)&resultPixel,iVar32,iVar12);
      pTVar40 = this_07;
      if (0 < this->m_numLevels) {
        lVar43 = 0;
        lVar36 = 0;
        resultPixel.m_data._0_8_ = this_07;
        do {
          tcu::Texture1DArray::allocLevel(this_07,(int)lVar36);
          swizzle((ConstPixelBufferAccess *)((long)(this->m_levels->m_size).m_data + lVar43 + -8),
                  (PixelBufferAccess *)
                  ((long)(((this_07->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess)
                         .m_size.m_data + lVar43 + -8),componentMapping);
          lVar36 = lVar36 + 1;
          lVar43 = lVar43 + 0x28;
          pTVar40 = (Texture1DArray *)resultPixel.m_data._0_8_;
        } while (lVar36 < this->m_numLevels);
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)pTVar40;
      de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::reset
                ((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
                 &resultPixel);
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupScale->m_data;
      fVar4 = resultPixel.m_data[componentMapping->a];
      fVar5 = resultPixel.m_data[componentMapping->b];
      fVar6 = resultPixel.m_data[componentMapping->g];
      fVar7 = resultPixel.m_data[componentMapping->r];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupBias->m_data;
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
        bVar25 = true;
      }
      else {
        fVar8 = resultPixel.m_data[componentMapping->a];
        fVar9 = resultPixel.m_data[componentMapping->b];
        fVar10 = resultPixel.m_data[componentMapping->g];
        fVar11 = resultPixel.m_data[componentMapping->r];
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
              auVar55._0_4_ = resultPixel.m_data[0] - fVar11;
              auVar55._4_4_ = resultPixel.m_data[1] - fVar10;
              auVar55._8_4_ = resultPixel.m_data[2] - fVar9;
              auVar55._12_4_ = resultPixel.m_data[3] - fVar8;
              auVar19._4_4_ = fVar6;
              auVar19._0_4_ = fVar7;
              auVar19._8_4_ = fVar5;
              auVar19._12_4_ = fVar4;
              resultColor.m_data = (float  [4])divps(auVar55,auVar19);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
              texCoord_7.m_data._8_8_ = (pTVar40->m_view).m_levels;
              texCoord_7.m_data[0] = (float)(pTVar40->m_view).m_numLevels;
              swizzledTex_6.
              super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
              m_data.ptr = (TextureCubeArray *)texCoord.m_data._0_8_;
              bVar26 = tcu::isLookupResultValid
                                 ((Texture1DArrayView *)&texCoord_7,sampler,lookupPrecision,
                                  (Vec2 *)&swizzledTex_6,lodBounds,&resultColor);
              uVar59 = (int)((uint)bVar26 << 0x1f) >> 0x1f;
              texCoord_7.m_data._0_8_ =
                   ~CONCAT44(uVar59,(int)((uint)bVar26 << 0x1f) >> 0x1f) &
                   SUB168(ZEXT416(0x3f800000),0) | ((ulong)uVar59 & 0x3f800000) << 0x20;
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
      de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::reset
                ((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
                 &swizzledTex);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    plVar30 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2D::typeinfo,0);
    plVar29 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2DArray::typeinfo,0)
    ;
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar32 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar32) {
      lVar36 = 0;
      lVar43 = 0;
      do {
        if (plVar30 == (long *)0x0) {
          lVar31 = (**(code **)(*plVar29 + 0x80))();
        }
        else {
          lVar31 = (**(code **)(*plVar30 + 0x80))(plVar30);
        }
        pCVar33 = (ConstPixelBufferAccess *)
                  (*(long *)(lVar31 + 0x20) +
                  (long)(int)(subresource->baseMipLevel + (int)lVar43) * 0x28);
        tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar33,0,0,
                          subresource->baseArrayLayer,(pCVar33->m_size).m_data[0],
                          (pCVar33->m_size).m_data[1],subresource->layerCount);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar36) = local_128;
        puVar3 = (undefined8 *)
                 ((long)((levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar36 + 8);
        *puVar3 = CONCAT44(iStack_134,local_138);
        puVar3[1] = CONCAT44(iStack_12c,iStack_130);
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar36 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(ulong *)(pfVar1 + 2) = CONCAT44(resultPixel.m_data[3],resultPixel.m_data[2]);
        lVar43 = lVar43 + 1;
        iVar32 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar36 = lVar36 + 0x28;
      } while (lVar43 < iVar32);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_02 = (Texture2DArrayView *)operator_new(0x10);
    tcu::Texture2DArrayView::Texture2DArrayView(this_02,iVar32,pCVar2);
    bVar25 = isIdentitySwizzle(componentMapping);
    local_f8 = SUB84(this_02,0);
    uStack_f4 = (undefined4)((ulong)this_02 >> 0x20);
    if (bVar25) {
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) goto LAB_004e510a;
      iVar12 = (resultAccess->m_size).m_data[0];
      iVar35 = 0;
      bVar25 = true;
      do {
        if (0 < iVar12) {
          iVar44 = 0;
          do {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
            auVar50._0_4_ = resultPixel.m_data[0] - lookupBias->m_data[0];
            auVar50._4_4_ = resultPixel.m_data[1] - lookupBias->m_data[1];
            auVar50._8_4_ = resultPixel.m_data[2] - lookupBias->m_data[2];
            auVar50._12_4_ = resultPixel.m_data[3] - lookupBias->m_data[3];
            resultColor.m_data =
                 (float  [4])divps(auVar50,*(undefined1 (*) [16])lookupScale->m_data);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
            VVar24 = texCoord;
            texCoord_7.m_data[0] = texCoord.m_data[0];
            texCoord_7.m_data[1] = texCoord.m_data[1];
            texCoord_7.m_data[2] = texCoord.m_data[2];
            texCoord = VVar24;
            bVar26 = tcu::isLookupResultValid
                               (this_02,sampler,lookupPrecision,(Vec3 *)&texCoord_7,lodBounds,
                                &resultColor);
            uVar59 = (int)((uint)bVar26 << 0x1f) >> 0x1f;
            texCoord_7.m_data._0_8_ =
                 ~CONCAT44(uVar59,(int)((uint)bVar26 << 0x1f) >> 0x1f) &
                 SUB168(ZEXT416(0x3f800000),0) | ((ulong)uVar59 & 0x3f800000) << 0x20;
            texCoord_7.m_data[2] = 0.0;
            texCoord_7.m_data[3] = 1.0;
            tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
            bVar25 = (bool)(bVar25 & bVar26);
            iVar44 = iVar44 + 1;
          } while (iVar12 != iVar44);
        }
        iVar35 = iVar35 + 1;
      } while (iVar35 != iVar32);
    }
    else {
      TVar27 = tcu::getTextureChannelClass((this_02->m_levels->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar27 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar27 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      pCVar33 = this_02->m_levels;
      this_08 = (Texture2DArray *)operator_new(0x58);
      tcu::Texture2DArray::Texture2DArray
                (this_08,(TextureFormat *)&resultPixel,(pCVar33->m_size).m_data[0],
                 (pCVar33->m_size).m_data[1],(pCVar33->m_size).m_data[2]);
      pTVar41 = this_08;
      if (0 < this_02->m_numLevels) {
        lVar43 = 0;
        lVar36 = 0;
        resultPixel.m_data._0_8_ = this_08;
        do {
          tcu::Texture2DArray::allocLevel(this_08,(int)lVar36);
          swizzle((ConstPixelBufferAccess *)((long)(this_02->m_levels->m_size).m_data + lVar43 + -8)
                  ,(PixelBufferAccess *)
                   ((long)(((this_08->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar43 + -8),componentMapping);
          lVar36 = lVar36 + 1;
          lVar43 = lVar43 + 0x28;
          pTVar41 = (Texture2DArray *)resultPixel.m_data._0_8_;
        } while (lVar36 < this_02->m_numLevels);
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)pTVar41;
      de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::reset
                ((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                 &resultPixel);
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupScale->m_data;
      fVar4 = resultPixel.m_data[componentMapping->a];
      fVar5 = resultPixel.m_data[componentMapping->b];
      fVar6 = resultPixel.m_data[componentMapping->g];
      fVar7 = resultPixel.m_data[componentMapping->r];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupBias->m_data;
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
        bVar25 = true;
      }
      else {
        fVar8 = resultPixel.m_data[componentMapping->a];
        fVar9 = resultPixel.m_data[componentMapping->b];
        fVar10 = resultPixel.m_data[componentMapping->g];
        fVar11 = resultPixel.m_data[componentMapping->r];
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar44,iVar35);
              auVar56._0_4_ = resultPixel.m_data[0] - fVar11;
              auVar56._4_4_ = resultPixel.m_data[1] - fVar10;
              auVar56._8_4_ = resultPixel.m_data[2] - fVar9;
              auVar56._12_4_ = resultPixel.m_data[3] - fVar8;
              auVar20._4_4_ = fVar6;
              auVar20._0_4_ = fVar7;
              auVar20._8_4_ = fVar5;
              auVar20._12_4_ = fVar4;
              resultColor.m_data = (float  [4])divps(auVar56,auVar20);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar44,iVar35);
              texCoord_7.m_data._8_8_ = (pTVar41->m_view).m_levels;
              texCoord_7.m_data[0] = (float)(pTVar41->m_view).m_numLevels;
              swizzledTex_6.
              super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
              m_data.ptr = (TextureCubeArray *)texCoord.m_data._0_8_;
              swizzledTex_6.
              super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
              m_data._8_4_ = texCoord.m_data[2];
              bVar26 = tcu::isLookupResultValid
                                 ((Texture2DArrayView *)&texCoord_7,sampler,lookupPrecision,
                                  (Vec3 *)&swizzledTex_6,lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar26) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
      de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::reset
                ((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                 &swizzledTex);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    plVar30 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTextureCubeArray::typeinfo,
                                     0);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    if (0 < (int)subresource->levelCount) {
      lVar36 = 0;
      lVar43 = 0;
      do {
        lVar31 = (**(code **)(*plVar30 + 0x80))(plVar30);
        pCVar33 = (ConstPixelBufferAccess *)
                  (*(long *)(lVar31 + 0x20) +
                  (long)(int)(subresource->baseMipLevel + (int)lVar43) * 0x28);
        tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar33,0,0,
                          subresource->baseArrayLayer,(pCVar33->m_size).m_data[0],
                          (pCVar33->m_size).m_data[1],subresource->layerCount);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar36) = local_128;
        auVar15._4_4_ = iStack_134;
        auVar15._0_4_ = local_138;
        auVar15._8_4_ = iStack_130;
        auVar15._12_4_ = iStack_12c;
        *(undefined1 (*) [16])
         ((long)((levels.
                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar36 + 8) = auVar15
        ;
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar36 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(ulong *)(pfVar1 + 2) = CONCAT44(resultPixel.m_data[3],resultPixel.m_data[2]);
        lVar43 = lVar43 + 1;
        lVar36 = lVar36 + 0x28;
      } while (lVar43 < (int)subresource->levelCount);
    }
    this_03 = (TextureCubeArrayView *)operator_new(0x10);
    tcu::TextureCubeArrayView::TextureCubeArrayView
              (this_03,(int)((ulong)((long)levels.
                                           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)levels.
                                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x33333333,
               levels.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar25 = isIdentitySwizzle(componentMapping);
    local_f8 = SUB84(this_03,0);
    uStack_f4 = (undefined4)((ulong)this_03 >> 0x20);
    if (bVar25) {
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) goto LAB_004e510a;
      iVar12 = (resultAccess->m_size).m_data[0];
      iVar35 = 0;
      bVar25 = true;
      do {
        if (0 < iVar12) {
          iVar44 = 0;
          do {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&resultColor,x,iVar44,iVar35);
            auVar51._0_4_ = resultColor.m_data[0] - lookupBias->m_data[0];
            auVar51._4_4_ = resultColor.m_data[1] - lookupBias->m_data[1];
            auVar51._8_4_ = resultColor.m_data[2] - lookupBias->m_data[2];
            auVar51._12_4_ = resultColor.m_data[3] - lookupBias->m_data[3];
            texCoord.m_data = (float  [4])divps(auVar51,*(undefined1 (*) [16])lookupScale->m_data);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&texCoord_7,x_00,iVar44,iVar35);
            resultPixel.m_data[2] = (float)(lookupPrecision->coordBits).m_data[0];
            resultPixel.m_data[1] = resultPixel.m_data[2];
            resultPixel.m_data[0] = resultPixel.m_data[2];
            resultPixel.m_data[3] = resultPixel.m_data[2];
            bVar26 = tcu::isLookupResultValid
                               (this_03,sampler,lookupPrecision,(IVec4 *)&resultPixel,&texCoord_7,
                                lodBounds,&texCoord);
            resultPixel.m_data[1] = 0.0;
            if (bVar26) {
              resultPixel.m_data[0] = 0.0;
              resultPixel.m_data[1] = 1.0;
            }
            else {
              resultPixel.m_data[0] = 1.0;
            }
            resultPixel.m_data[2] = 0.0;
            resultPixel.m_data[3] = 1.0;
            tcu::PixelBufferAccess::setPixel(errorAccess,&resultPixel,iVar44,iVar35,0);
            bVar25 = (bool)(bVar25 & bVar26);
            iVar44 = iVar44 + 1;
          } while (iVar12 != iVar44);
        }
        iVar35 = iVar35 + 1;
      } while (iVar35 != iVar32);
    }
    else {
      TVar27 = tcu::getTextureChannelClass((this_03->m_levels->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar27 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar27 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      iVar32 = (this_03->m_levels->m_size).m_data[0];
      iVar12 = (this_03->m_levels->m_size).m_data[2];
      this_09 = (TextureCubeArray *)operator_new(0x50);
      tcu::TextureCubeArray::TextureCubeArray(this_09,(TextureFormat *)&resultPixel,iVar32,iVar12);
      pTVar42 = this_09;
      if (0 < this_03->m_numLevels) {
        lVar43 = 0;
        lVar36 = 0;
        resultPixel.m_data._0_8_ = this_09;
        do {
          tcu::TextureCubeArray::allocLevel(this_09,(int)lVar36);
          swizzle((ConstPixelBufferAccess *)((long)(this_03->m_levels->m_size).m_data + lVar43 + -8)
                  ,(PixelBufferAccess *)
                   ((long)(((this_09->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar43 + -8),componentMapping);
          lVar36 = lVar36 + 1;
          lVar43 = lVar43 + 0x28;
          pTVar42 = (TextureCubeArray *)resultPixel.m_data._0_8_;
        } while (lVar36 < this_03->m_numLevels);
      }
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.ptr
           = pTVar42;
      de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
      reset((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)
            &resultPixel);
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupScale->m_data;
      fVar4 = resultPixel.m_data[componentMapping->a];
      fVar5 = resultPixel.m_data[componentMapping->b];
      fVar6 = resultPixel.m_data[componentMapping->g];
      fVar7 = resultPixel.m_data[componentMapping->r];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[2] = 1.0;
      resultPixel.m_data[3] = (float)*(undefined8 *)lookupBias->m_data;
      iVar32 = (resultAccess->m_size).m_data[1];
      if (iVar32 < 1) {
        bVar25 = true;
      }
      else {
        fVar8 = resultPixel.m_data[componentMapping->a];
        fVar9 = resultPixel.m_data[componentMapping->b];
        fVar10 = resultPixel.m_data[componentMapping->g];
        fVar11 = resultPixel.m_data[componentMapping->r];
        iVar12 = (resultAccess->m_size).m_data[0];
        iVar35 = 0;
        bVar25 = true;
        do {
          if (0 < iVar12) {
            iVar44 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultColor,x,iVar44,iVar35);
              auVar57._0_4_ = resultColor.m_data[0] - fVar11;
              auVar57._4_4_ = resultColor.m_data[1] - fVar10;
              auVar57._8_4_ = resultColor.m_data[2] - fVar9;
              auVar57._12_4_ = resultColor.m_data[3] - fVar8;
              auVar22._4_4_ = fVar6;
              auVar22._0_4_ = fVar7;
              auVar22._8_4_ = fVar5;
              auVar22._12_4_ = fVar4;
              texCoord.m_data = (float  [4])divps(auVar57,auVar22);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord_7,x_00,iVar44,iVar35);
              swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
              m_data._8_8_ = (pTVar42->m_view).m_levels;
              swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
              m_data.ptr = (Texture1D *)
                           CONCAT44(swizzledTex.
                                    super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>
                                    .m_data.ptr._4_4_,(pTVar42->m_view).m_numLevels);
              resultPixel.m_data[2] = (float)(lookupPrecision->coordBits).m_data[0];
              resultPixel.m_data[1] = resultPixel.m_data[2];
              resultPixel.m_data[0] = resultPixel.m_data[2];
              resultPixel.m_data[3] = resultPixel.m_data[2];
              bVar26 = tcu::isLookupResultValid
                                 ((TextureCubeArrayView *)&swizzledTex,sampler,lookupPrecision,
                                  (IVec4 *)&resultPixel,&texCoord_7,lodBounds,&texCoord);
              resultPixel.m_data[1] = 0.0;
              if (bVar26) {
                resultPixel.m_data[0] = 0.0;
                resultPixel.m_data[1] = 1.0;
              }
              else {
                resultPixel.m_data[0] = 1.0;
              }
              resultPixel.m_data[2] = 0.0;
              resultPixel.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&resultPixel,iVar44,iVar35,0);
              bVar25 = (bool)(bVar25 & bVar26);
              iVar44 = iVar44 + 1;
            } while (iVar12 != iVar44);
          }
          iVar35 = iVar35 + 1;
        } while (iVar35 != iVar32);
      }
      de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
      reset(&swizzledTex_6.
             super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>);
    }
    break;
  default:
    return false;
  }
  uVar34 = 0x10;
  this_01 = (TextureCubeView *)CONCAT44(uStack_f4,local_f8);
LAB_004e6222:
  operator_delete(this_01,uVar34);
  if (levels.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(levels.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar25;
}

Assistant:

bool validateResultImage (const TestTexture&					texture,
						  const VkImageViewType					imageViewType,
						  const VkImageSubresourceRange&		subresource,
						  const tcu::Sampler&					sampler,
						  const vk::VkComponentMapping&			componentMapping,
						  const tcu::ConstPixelBufferAccess&	coordAccess,
						  const tcu::Vec2&						lodBounds,
						  const tcu::LookupPrecision&			lookupPrecision,
						  const tcu::Vec4&						lookupScale,
						  const tcu::Vec4&						lookupBias,
						  const tcu::ConstPixelBufferAccess&	resultAccess,
						  const tcu::PixelBufferAccess&			errorAccess)
{
	std::vector<tcu::ConstPixelBufferAccess>	levels;

	switch (imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
		{
			UniquePtr<tcu::Texture1DView>			texView(getTexture1DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		{
			UniquePtr<tcu::Texture1DArrayView>		texView(getTexture1DArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_2D:
		{
			UniquePtr<tcu::Texture2DView>			texView(getTexture2DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		{
			UniquePtr<tcu::Texture2DArrayView>		texView(getTexture2DArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_CUBE:
		{
			UniquePtr<tcu::TextureCubeView>			texView(getTextureCubeView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
		{
			UniquePtr<tcu::TextureCubeArrayView>	texView(getTextureCubeArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
			break;
		}

		case VK_IMAGE_VIEW_TYPE_3D:
		{
			UniquePtr<tcu::Texture3DView>			texView(getTexture3DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		default:
			DE_ASSERT(false);
			return false;
	}
}